

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

longlong mkvparser::Segment::CreateInstance(IMkvReader *pReader,longlong pos,Segment **pSegment)

{
  bool bVar1;
  Segment **ppSVar2;
  int iVar3;
  ulong uVar4;
  longlong lVar5;
  Segment *this;
  ulong uVar6;
  ulong pos_00;
  ulong uVar7;
  ulong unaff_R15;
  long len;
  longlong total;
  longlong available;
  long local_50;
  ulong local_48;
  ulong local_40;
  Segment **local_38;
  
  uVar7 = 0xffffffffffffffff;
  if (-1 < pos && pReader != (IMkvReader *)0x0) {
    *pSegment = (Segment *)0x0;
    iVar3 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_48,&local_40);
    if (iVar3 < 0) {
      uVar7 = (ulong)iVar3;
    }
    else {
      uVar7 = 0xffffffffffffffff;
      if ((-1 < (long)local_40) && (local_38 = pSegment, local_40 <= local_48)) {
        do {
          if ((-1 < (long)local_48) && ((long)local_48 <= pos)) {
            return -2;
          }
          uVar4 = GetUIntLength(pReader,pos,&local_50);
          if (uVar4 == 0) {
            if ((-1 < (long)local_48) && ((long)local_48 < local_50 + pos)) {
              uVar4 = 0xfffffffffffffffe;
              goto LAB_001548ac;
            }
            uVar4 = local_50 + pos;
            if ((long)local_40 < (long)uVar4) goto LAB_001548ac;
            lVar5 = ReadID(pReader,pos,&local_50);
            uVar4 = 0xfffffffffffffffe;
            if (lVar5 < 0) goto LAB_001548ac;
            pos_00 = local_50 + pos;
            uVar7 = GetUIntLength(pReader,pos_00,&local_50);
            if (uVar7 == 0) {
              if (((long)local_48 < 0) || ((long)(local_50 + pos_00) <= (long)local_48)) {
                uVar7 = local_50 + pos_00;
                if (((long)local_40 < (long)uVar7) ||
                   (uVar7 = ReadUInt(pReader,pos_00,&local_50), ppSVar2 = local_38, (long)uVar7 < 0)
                   ) goto LAB_0015492c;
                pos_00 = pos_00 + local_50;
                uVar6 = -1L << ((char)local_50 * '\a' & 0x3fU) ^ uVar7;
                if (lVar5 == 0x18538067) {
                  uVar4 = 0xffffffffffffffff;
                  if (((uVar6 != 0xffffffffffffffff) && (-1 < (long)local_48)) &&
                     (uVar4 = uVar7, (long)local_48 < (long)(uVar7 + pos_00))) {
                    uVar4 = 0xffffffffffffffff;
                  }
                  this = (Segment *)operator_new(200,(nothrow_t *)&std::nothrow);
                  if (this == (Segment *)0x0) {
                    this = (Segment *)0x0;
                  }
                  else {
                    Segment(this,pReader,pos,pos_00,uVar4);
                  }
                  *ppSVar2 = this;
                  bVar1 = false;
                  uVar7 = -(ulong)(this == (Segment *)0x0);
                }
                else {
                  if ((uVar6 == 0xffffffffffffffff) ||
                     ((uVar6 = uVar7 + pos_00, -1 < (long)local_48 && ((long)local_48 < (long)uVar6)
                      ))) goto LAB_0015494d;
                  if ((long)uVar6 <= (long)local_40) {
                    pos_00 = uVar6;
                  }
                  bVar1 = (long)uVar6 <= (long)local_40;
                  uVar7 = unaff_R15;
                  if ((long)local_40 < (long)uVar6) {
                    uVar7 = uVar6;
                  }
                }
              }
              else {
LAB_0015494d:
                bVar1 = false;
                uVar7 = uVar4;
              }
            }
            else {
LAB_0015492c:
              bVar1 = false;
            }
          }
          else {
LAB_001548ac:
            bVar1 = false;
            pos_00 = pos;
            uVar7 = uVar4;
          }
          pos = pos_00;
          unaff_R15 = uVar7;
        } while (bVar1);
      }
    }
  }
  return uVar7;
}

Assistant:

long long Segment::CreateInstance(IMkvReader* pReader, long long pos,
                                  Segment*& pSegment) {
  if (pReader == NULL || pos < 0)
    return E_PARSE_FAILED;

  pSegment = NULL;

  long long total, available;

  const long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (available < 0)
    return -1;

  if ((total >= 0) && (available > total))
    return -1;

  // I would assume that in practice this loop would execute
  // exactly once, but we allow for other elements (e.g. Void)
  // to immediately follow the EBML header.  This is fine for
  // the source filter case (since the entire file is available),
  // but in the splitter case over a network we should probably
  // just give up early.  We could for example decide only to
  // execute this loop a maximum of, say, 10 times.
  // TODO:
  // There is an implied "give up early" by only parsing up
  // to the available limit.  We do do that, but only if the
  // total file size is unknown.  We could decide to always
  // use what's available as our limit (irrespective of whether
  // we happen to know the total file length).  This would have
  // as its sense "parse this much of the file before giving up",
  // which a slightly different sense from "try to parse up to
  // 10 EMBL elements before giving up".

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return E_FILE_FORMAT_INVALID;

    // Read ID
    long len;
    long long result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return size;

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    // Handle "unknown size" for live streaming of webm files.
    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (id == libwebm::kMkvSegment) {
      if (size == unknown_size)
        size = -1;

      else if (total < 0)
        size = -1;

      else if ((pos + size) > total)
        size = -1;

      pSegment = new (std::nothrow) Segment(pReader, idpos, pos, size);
      if (pSegment == NULL)
        return E_PARSE_FAILED;

      return 0;  // success
    }

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + size) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + size) > available)
      return pos + size;

    pos += size;  // consume payload
  }
}